

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersector1<8,_1048576,_false,_embree::avx2::ArrayIntersector1<embree::avx2::TriangleMIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  BaseNode_conflict *node;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  byte bVar17;
  undefined4 uVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  float fVar32;
  uint uVar35;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined8 uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  float fVar45;
  float fVar46;
  undefined1 auVar44 [64];
  undefined1 auVar47 [16];
  uint uVar49;
  uint uVar50;
  undefined1 auVar48 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_146c;
  RTCIntersectArguments *local_1468;
  long local_1460;
  ulong local_1458;
  RayQueryContext *local_1450;
  Geometry *local_1448;
  long local_1440;
  long local_1438;
  ulong local_1430;
  ulong *local_1428;
  Scene *local_1420;
  undefined4 local_1418;
  undefined4 local_1414;
  undefined4 local_1410;
  undefined4 local_140c;
  undefined4 local_1408;
  undefined4 local_1404;
  uint local_1400;
  uint local_13fc;
  uint local_13f8;
  RTCFilterFunctionNArguments local_13e8;
  undefined1 local_13b8 [16];
  undefined1 local_13a8 [16];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1348 [16];
  float local_1338 [4];
  undefined1 local_1328 [16];
  float local_1318 [4];
  undefined1 local_1308 [16];
  undefined1 local_12f8 [16];
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar43 = ray->tfar;
    if (0.0 <= fVar43) {
      local_1450 = context;
      local_1428 = local_11d0;
      auVar8 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar1 = (ray->dir).field_0;
      local_13a8._8_4_ = 0x7fffffff;
      local_13a8._0_8_ = 0x7fffffff7fffffff;
      local_13a8._12_4_ = 0x7fffffff;
      auVar7 = vandps_avx((undefined1  [16])aVar1,local_13a8);
      auVar39._8_4_ = 0x219392ef;
      auVar39._0_8_ = 0x219392ef219392ef;
      auVar39._12_4_ = 0x219392ef;
      auVar7 = vcmpps_avx(auVar7,auVar39,1);
      auVar7 = vblendvps_avx((undefined1  [16])aVar1,auVar39,auVar7);
      auVar39 = vrcpps_avx(auVar7);
      auVar40._8_4_ = 0x3f800000;
      auVar40._0_8_ = 0x3f8000003f800000;
      auVar40._12_4_ = 0x3f800000;
      auVar7 = vfnmadd213ps_fma(auVar7,auVar39,auVar40);
      auVar10 = vfmadd132ps_fma(auVar7,auVar39,auVar39);
      fVar32 = auVar10._0_4_;
      local_11f8._4_4_ = fVar32;
      local_11f8._0_4_ = fVar32;
      local_11f8._8_4_ = fVar32;
      local_11f8._12_4_ = fVar32;
      local_11f8._16_4_ = fVar32;
      local_11f8._20_4_ = fVar32;
      local_11f8._24_4_ = fVar32;
      local_11f8._28_4_ = fVar32;
      auVar44 = ZEXT3264(local_11f8);
      auVar7 = vmovshdup_avx(auVar10);
      uVar36 = auVar7._0_8_;
      local_1218._8_8_ = uVar36;
      local_1218._0_8_ = uVar36;
      local_1218._16_8_ = uVar36;
      local_1218._24_8_ = uVar36;
      auVar48 = ZEXT3264(local_1218);
      auVar40 = vshufpd_avx(auVar10,auVar10,1);
      auVar39 = vshufps_avx(auVar10,auVar10,0xaa);
      uVar36 = auVar39._0_8_;
      local_1238._8_8_ = uVar36;
      local_1238._0_8_ = uVar36;
      local_1238._16_8_ = uVar36;
      local_1238._24_8_ = uVar36;
      auVar52 = ZEXT3264(local_1238);
      auVar33._0_4_ = fVar32 * (ray->org).field_0.m128[0];
      auVar33._4_4_ = auVar10._4_4_ * (ray->org).field_0.m128[1];
      auVar33._8_4_ = auVar10._8_4_ * (ray->org).field_0.m128[2];
      auVar33._12_4_ = auVar10._12_4_ * (ray->org).field_0.m128[3];
      auVar39 = vmovshdup_avx(auVar33);
      auVar10 = vshufps_avx(auVar33,auVar33,0xaa);
      local_1430 = (ulong)(fVar32 < 0.0) << 3;
      uVar11 = (ulong)(auVar7._0_4_ < 0.0);
      uVar12 = (ulong)(auVar40._0_4_ < 0.0);
      uVar20 = local_1430 ^ 8;
      uVar21 = CONCAT44(auVar33._0_4_,auVar33._0_4_);
      local_1258._0_8_ = uVar21 ^ 0x8000000080000000;
      local_1258._8_4_ = -auVar33._0_4_;
      local_1258._12_4_ = -auVar33._0_4_;
      local_1258._16_4_ = -auVar33._0_4_;
      local_1258._20_4_ = -auVar33._0_4_;
      local_1258._24_4_ = -auVar33._0_4_;
      local_1258._28_4_ = -auVar33._0_4_;
      auVar58 = ZEXT3264(local_1258);
      uVar14 = auVar39._0_4_;
      uVar35 = auVar39._4_4_;
      local_1278._0_8_ = auVar39._0_8_ ^ 0x8000000080000000;
      local_1278._8_4_ = uVar14 ^ 0x80000000;
      local_1278._12_4_ = uVar35 ^ 0x80000000;
      local_1278._16_4_ = uVar14 ^ 0x80000000;
      local_1278._20_4_ = uVar35 ^ 0x80000000;
      local_1278._24_4_ = uVar14 ^ 0x80000000;
      local_1278._28_4_ = uVar35 ^ 0x80000000;
      auVar60 = ZEXT3264(local_1278);
      uVar14 = auVar10._0_4_;
      uVar35 = auVar10._4_4_;
      local_1298._0_8_ = auVar10._0_8_ ^ 0x8000000080000000;
      local_1298._8_4_ = uVar14 ^ 0x80000000;
      local_1298._12_4_ = uVar35 ^ 0x80000000;
      local_1298._16_4_ = uVar14 ^ 0x80000000;
      local_1298._20_4_ = uVar35 ^ 0x80000000;
      local_1298._24_4_ = uVar14 ^ 0x80000000;
      local_1298._28_4_ = uVar35 ^ 0x80000000;
      auVar63 = ZEXT3264(local_1298);
      uVar18 = auVar8._0_4_;
      local_12b8._4_4_ = uVar18;
      local_12b8._0_4_ = uVar18;
      local_12b8._8_4_ = uVar18;
      local_12b8._12_4_ = uVar18;
      local_12b8._16_4_ = uVar18;
      local_12b8._20_4_ = uVar18;
      local_12b8._24_4_ = uVar18;
      local_12b8._28_4_ = uVar18;
      auVar66 = ZEXT3264(local_12b8);
      local_12d8._4_4_ = fVar43;
      local_12d8._0_4_ = fVar43;
      local_12d8._8_4_ = fVar43;
      local_12d8._12_4_ = fVar43;
      local_12d8._16_4_ = fVar43;
      local_12d8._20_4_ = fVar43;
      local_12d8._24_4_ = fVar43;
      local_12d8._28_4_ = fVar43;
      auVar68 = ZEXT3264(local_12d8);
      local_13b8 = mm_lookupmask_ps._240_16_;
LAB_004d3a3a:
      do {
        uVar21 = local_1428[-1];
        local_1428 = local_1428 + -1;
        while ((uVar21 & 8) == 0) {
          uVar13 = uVar21 & 0xfffffffffffffff0;
          puVar19 = (ulong *)(uVar13 + 0x40);
          if (uVar13 == 0) {
            puVar19 = (ulong *)0x0;
          }
          auVar7._8_8_ = 0;
          auVar7._0_8_ = *puVar19;
          auVar39 = vpmovzxbw_avx(auVar7);
          auVar8._8_8_ = 0;
          auVar8._0_8_ = puVar19[1];
          auVar7 = vpmovzxbw_avx(auVar8);
          auVar7 = vpminuw_avx(auVar39,auVar7);
          auVar7 = vpcmpeqw_avx(auVar39,auVar7);
          auVar7 = vpacksswb_avx(auVar7,auVar7);
          uVar18 = (undefined4)puVar19[6];
          auVar26._4_4_ = uVar18;
          auVar26._0_4_ = uVar18;
          auVar26._8_4_ = uVar18;
          auVar26._12_4_ = uVar18;
          auVar26._16_4_ = uVar18;
          auVar26._20_4_ = uVar18;
          auVar26._24_4_ = uVar18;
          auVar26._28_4_ = uVar18;
          uVar18 = *(undefined4 *)((long)puVar19 + 0x3c);
          auVar29._4_4_ = uVar18;
          auVar29._0_4_ = uVar18;
          auVar29._8_4_ = uVar18;
          auVar29._12_4_ = uVar18;
          auVar29._16_4_ = uVar18;
          auVar29._20_4_ = uVar18;
          auVar29._24_4_ = uVar18;
          auVar29._28_4_ = uVar18;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *(ulong *)((long)puVar19 + local_1430);
          auVar9 = vpmovzxbd_avx2(auVar10);
          auVar9 = vcvtdq2ps_avx(auVar9);
          auVar8 = vfmadd213ps_fma(auVar9,auVar29,auVar26);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)((long)puVar19 + uVar20);
          auVar9 = vpmovzxbd_avx2(auVar2);
          auVar9 = vcvtdq2ps_avx(auVar9);
          auVar39 = vfmadd213ps_fma(auVar9,auVar29,auVar26);
          uVar18 = *(undefined4 *)((long)puVar19 + 0x34);
          auVar27._4_4_ = uVar18;
          auVar27._0_4_ = uVar18;
          auVar27._8_4_ = uVar18;
          auVar27._12_4_ = uVar18;
          auVar27._16_4_ = uVar18;
          auVar27._20_4_ = uVar18;
          auVar27._24_4_ = uVar18;
          auVar27._28_4_ = uVar18;
          uVar18 = (undefined4)puVar19[8];
          auVar30._4_4_ = uVar18;
          auVar30._0_4_ = uVar18;
          auVar30._8_4_ = uVar18;
          auVar30._12_4_ = uVar18;
          auVar30._16_4_ = uVar18;
          auVar30._20_4_ = uVar18;
          auVar30._24_4_ = uVar18;
          auVar30._28_4_ = uVar18;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = puVar19[uVar11 + 2];
          auVar9 = vpmovzxbd_avx2(auVar3);
          auVar9 = vcvtdq2ps_avx(auVar9);
          auVar40 = vfmadd213ps_fma(auVar9,auVar30,auVar27);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)((long)puVar19 + (uVar11 * 8 + 0x10 ^ 8));
          auVar9 = vpmovzxbd_avx2(auVar4);
          auVar9 = vcvtdq2ps_avx(auVar9);
          auVar10 = vfmadd213ps_fma(auVar9,auVar30,auVar27);
          uVar18 = (undefined4)puVar19[7];
          auVar28._4_4_ = uVar18;
          auVar28._0_4_ = uVar18;
          auVar28._8_4_ = uVar18;
          auVar28._12_4_ = uVar18;
          auVar28._16_4_ = uVar18;
          auVar28._20_4_ = uVar18;
          auVar28._24_4_ = uVar18;
          auVar28._28_4_ = uVar18;
          uVar18 = *(undefined4 *)((long)puVar19 + 0x44);
          auVar31._4_4_ = uVar18;
          auVar31._0_4_ = uVar18;
          auVar31._8_4_ = uVar18;
          auVar31._12_4_ = uVar18;
          auVar31._16_4_ = uVar18;
          auVar31._20_4_ = uVar18;
          auVar31._24_4_ = uVar18;
          auVar31._28_4_ = uVar18;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = puVar19[uVar12 + 4];
          auVar9 = vpmovzxbd_avx2(auVar5);
          auVar9 = vcvtdq2ps_avx(auVar9);
          auVar33 = vfmadd213ps_fma(auVar9,auVar31,auVar28);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = *(ulong *)((long)puVar19 + (uVar12 * 8 + 0x20 ^ 8));
          auVar9 = vpmovzxbd_avx2(auVar6);
          auVar9 = vcvtdq2ps_avx(auVar9);
          auVar2 = vfmadd213ps_fma(auVar9,auVar31,auVar28);
          auVar8 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar44._0_32_,auVar58._0_32_);
          auVar40 = vfmadd213ps_fma(ZEXT1632(auVar40),auVar48._0_32_,auVar60._0_32_);
          auVar9 = vpmaxsd_avx2(ZEXT1632(auVar8),ZEXT1632(auVar40));
          auVar8 = vfmadd213ps_fma(ZEXT1632(auVar33),auVar52._0_32_,auVar63._0_32_);
          auVar26 = vpmaxsd_avx2(ZEXT1632(auVar8),auVar66._0_32_);
          auVar9 = vpmaxsd_avx2(auVar9,auVar26);
          auVar8 = vfmadd213ps_fma(ZEXT1632(auVar39),auVar44._0_32_,auVar58._0_32_);
          auVar39 = vfmadd213ps_fma(ZEXT1632(auVar10),auVar48._0_32_,auVar60._0_32_);
          auVar26 = vpminsd_avx2(ZEXT1632(auVar8),ZEXT1632(auVar39));
          auVar8 = vfmadd213ps_fma(ZEXT1632(auVar2),auVar52._0_32_,auVar63._0_32_);
          auVar27 = vpminsd_avx2(ZEXT1632(auVar8),auVar68._0_32_);
          auVar26 = vpminsd_avx2(auVar26,auVar27);
          auVar9 = vpcmpgtd_avx2(auVar9,auVar26);
          uVar18 = vmovmskps_avx(auVar9);
          bVar17 = ~(byte)uVar18 &
                   (SUB161(auVar7 >> 7,0) & 1 | (SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                    (SUB161(auVar7 >> 0x17,0) & 1) << 2 | (SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                    (SUB161(auVar7 >> 0x27,0) & 1) << 4 | (SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                    (SUB161(auVar7 >> 0x37,0) & 1) << 6 | SUB161(auVar7 >> 0x3f,0) << 7);
          if (bVar17 == 0) {
            if (local_1428 == &local_11d8) {
              return;
            }
            goto LAB_004d3a3a;
          }
          lVar16 = 0;
          for (uVar21 = (ulong)bVar17; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000)
          {
            lVar16 = lVar16 + 1;
          }
          uVar21 = *(ulong *)(uVar13 + lVar16 * 8);
          uVar14 = bVar17 - 1 & (uint)bVar17;
          uVar15 = (ulong)uVar14;
          if (uVar14 != 0) {
            *local_1428 = uVar21;
            lVar16 = 0;
            for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
              lVar16 = lVar16 + 1;
            }
            uVar14 = uVar14 - 1 & uVar14;
            uVar15 = (ulong)uVar14;
            bVar22 = uVar14 == 0;
            while( true ) {
              local_1428 = local_1428 + 1;
              uVar21 = *(ulong *)(uVar13 + lVar16 * 8);
              if (bVar22) break;
              *local_1428 = uVar21;
              lVar16 = 0;
              for (uVar21 = uVar15; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                lVar16 = lVar16 + 1;
              }
              uVar15 = uVar15 - 1 & uVar15;
              bVar22 = uVar15 == 0;
            }
          }
        }
        local_1438 = (ulong)((uint)uVar21 & 0xf) - 8;
        if (local_1438 != 0) {
          uVar21 = uVar21 & 0xfffffffffffffff0;
          local_1440 = 0;
          do {
            lVar16 = local_1440 * 0xb0;
            auVar7 = *(undefined1 (*) [16])(uVar21 + 0x80 + lVar16);
            auVar8 = *(undefined1 (*) [16])(uVar21 + 0x40 + lVar16);
            auVar39 = *(undefined1 (*) [16])(uVar21 + 0x70 + lVar16);
            auVar40 = *(undefined1 (*) [16])(uVar21 + 0x50 + lVar16);
            auVar23._0_4_ = auVar7._0_4_ * auVar8._0_4_;
            auVar23._4_4_ = auVar7._4_4_ * auVar8._4_4_;
            auVar23._8_4_ = auVar7._8_4_ * auVar8._8_4_;
            auVar23._12_4_ = auVar7._12_4_ * auVar8._12_4_;
            local_1308 = vfmsub231ps_fma(auVar23,auVar39,auVar40);
            auVar10 = *(undefined1 (*) [16])(uVar21 + 0x60 + lVar16);
            auVar33 = *(undefined1 (*) [16])(uVar21 + 0x30 + lVar16);
            auVar24._0_4_ = auVar40._0_4_ * auVar10._0_4_;
            auVar24._4_4_ = auVar40._4_4_ * auVar10._4_4_;
            auVar24._8_4_ = auVar40._8_4_ * auVar10._8_4_;
            auVar24._12_4_ = auVar40._12_4_ * auVar10._12_4_;
            local_12f8 = vfmsub231ps_fma(auVar24,auVar7,auVar33);
            uVar18 = *(undefined4 *)&(ray->org).field_0;
            auVar53._4_4_ = uVar18;
            auVar53._0_4_ = uVar18;
            auVar53._8_4_ = uVar18;
            auVar53._12_4_ = uVar18;
            auVar2 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + lVar16),auVar53);
            uVar18 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar54._4_4_ = uVar18;
            auVar54._0_4_ = uVar18;
            auVar54._8_4_ = uVar18;
            auVar54._12_4_ = uVar18;
            auVar3 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x10 + lVar16),auVar54);
            uVar18 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar55._4_4_ = uVar18;
            auVar55._0_4_ = uVar18;
            auVar55._8_4_ = uVar18;
            auVar55._12_4_ = uVar18;
            auVar4 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x20 + lVar16),auVar55);
            fVar43 = (ray->dir).field_0.m128[0];
            auVar56._4_4_ = fVar43;
            auVar56._0_4_ = fVar43;
            auVar56._8_4_ = fVar43;
            auVar56._12_4_ = fVar43;
            fVar32 = (ray->dir).field_0.m128[1];
            auVar59._4_4_ = fVar32;
            auVar59._0_4_ = fVar32;
            auVar59._8_4_ = fVar32;
            auVar59._12_4_ = fVar32;
            fVar45 = (ray->dir).field_0.m128[2];
            auVar61._4_4_ = fVar45;
            auVar61._0_4_ = fVar45;
            auVar61._8_4_ = fVar45;
            auVar61._12_4_ = fVar45;
            auVar64._0_4_ = fVar43 * auVar3._0_4_;
            auVar64._4_4_ = fVar43 * auVar3._4_4_;
            auVar64._8_4_ = fVar43 * auVar3._8_4_;
            auVar64._12_4_ = fVar43 * auVar3._12_4_;
            auVar5 = vfmsub231ps_fma(auVar64,auVar2,auVar59);
            auVar51._0_4_ = auVar7._0_4_ * auVar5._0_4_;
            auVar51._4_4_ = auVar7._4_4_ * auVar5._4_4_;
            auVar51._8_4_ = auVar7._8_4_ * auVar5._8_4_;
            auVar51._12_4_ = auVar7._12_4_ * auVar5._12_4_;
            auVar65._0_4_ = auVar40._0_4_ * auVar5._0_4_;
            auVar65._4_4_ = auVar40._4_4_ * auVar5._4_4_;
            auVar65._8_4_ = auVar40._8_4_ * auVar5._8_4_;
            auVar65._12_4_ = auVar40._12_4_ * auVar5._12_4_;
            auVar47._0_4_ = fVar45 * auVar2._0_4_;
            auVar47._4_4_ = fVar45 * auVar2._4_4_;
            auVar47._8_4_ = fVar45 * auVar2._8_4_;
            auVar47._12_4_ = fVar45 * auVar2._12_4_;
            auVar40 = vfmsub231ps_fma(auVar47,auVar4,auVar56);
            auVar7 = vfmadd231ps_fma(auVar51,auVar40,auVar39);
            auVar40 = vfmadd231ps_fma(auVar65,auVar8,auVar40);
            auVar41._0_4_ = auVar33._0_4_ * auVar39._0_4_;
            auVar41._4_4_ = auVar33._4_4_ * auVar39._4_4_;
            auVar41._8_4_ = auVar33._8_4_ * auVar39._8_4_;
            auVar41._12_4_ = auVar33._12_4_ * auVar39._12_4_;
            local_12e8 = vfmsub231ps_fma(auVar41,auVar10,auVar8);
            auVar67._0_4_ = fVar32 * auVar4._0_4_;
            auVar67._4_4_ = fVar32 * auVar4._4_4_;
            auVar67._8_4_ = fVar32 * auVar4._8_4_;
            auVar67._12_4_ = fVar32 * auVar4._12_4_;
            auVar5 = vfmsub231ps_fma(auVar67,auVar3,auVar61);
            auVar62._0_4_ = fVar45 * local_12e8._0_4_;
            auVar62._4_4_ = fVar45 * local_12e8._4_4_;
            auVar62._8_4_ = fVar45 * local_12e8._8_4_;
            auVar62._12_4_ = fVar45 * local_12e8._12_4_;
            auVar8 = vfmadd231ps_fma(auVar62,local_12f8,auVar59);
            auVar39 = vfmadd231ps_fma(auVar8,local_1308,auVar56);
            auVar8 = vfmadd231ps_fma(auVar7,auVar5,auVar10);
            auVar42._8_8_ = 0x8000000080000000;
            auVar42._0_8_ = 0x8000000080000000;
            auVar7 = vandps_avx(auVar39,auVar42);
            uVar14 = auVar7._0_4_;
            local_1398._0_4_ = (float)(uVar14 ^ auVar8._0_4_);
            uVar35 = auVar7._4_4_;
            local_1398._4_4_ = (float)(uVar35 ^ auVar8._4_4_);
            uVar49 = auVar7._8_4_;
            local_1398._8_4_ = (float)(uVar49 ^ auVar8._8_4_);
            uVar50 = auVar7._12_4_;
            local_1398._12_4_ = (float)(uVar50 ^ auVar8._12_4_);
            auVar7 = vfmadd231ps_fma(auVar40,auVar33,auVar5);
            local_1388._0_4_ = (float)(uVar14 ^ auVar7._0_4_);
            local_1388._4_4_ = (float)(uVar35 ^ auVar7._4_4_);
            local_1388._8_4_ = (float)(uVar49 ^ auVar7._8_4_);
            local_1388._12_4_ = (float)(uVar50 ^ auVar7._12_4_);
            auVar40 = ZEXT416(0) << 0x20;
            auVar7 = vcmpps_avx(local_1398,auVar40,5);
            auVar8 = vcmpps_avx(local_1388,auVar40,5);
            auVar7 = vandps_avx(auVar7,auVar8);
            local_1368 = vandps_avx(auVar39,local_13a8);
            auVar8 = vcmpps_avx(auVar39,auVar40,4);
            auVar7 = vandps_avx(auVar7,auVar8);
            auVar57._0_4_ = local_1398._0_4_ + local_1388._0_4_;
            auVar57._4_4_ = local_1398._4_4_ + local_1388._4_4_;
            auVar57._8_4_ = local_1398._8_4_ + local_1388._8_4_;
            auVar57._12_4_ = local_1398._12_4_ + local_1388._12_4_;
            auVar8 = vcmpps_avx(auVar57,local_1368,2);
            auVar7 = vandps_avx(auVar7,auVar8);
            auVar8 = local_13b8 & auVar7;
            if ((((auVar8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar8[0xf] < '\0') {
              auVar7 = vandps_avx(auVar7,local_13b8);
              auVar37._0_4_ = local_12e8._0_4_ * auVar4._0_4_;
              auVar37._4_4_ = local_12e8._4_4_ * auVar4._4_4_;
              auVar37._8_4_ = local_12e8._8_4_ * auVar4._8_4_;
              auVar37._12_4_ = local_12e8._12_4_ * auVar4._12_4_;
              auVar8 = vfmadd213ps_fma(auVar3,local_12f8,auVar37);
              auVar8 = vfmadd213ps_fma(auVar2,local_1308,auVar8);
              local_1378._0_4_ = (float)(uVar14 ^ auVar8._0_4_);
              local_1378._4_4_ = (float)(uVar35 ^ auVar8._4_4_);
              local_1378._8_4_ = (float)(uVar49 ^ auVar8._8_4_);
              local_1378._12_4_ = (float)(uVar50 ^ auVar8._12_4_);
              fVar43 = (ray->org).field_0.m128[3];
              auVar34._0_4_ = local_1368._0_4_ * fVar43;
              auVar34._4_4_ = local_1368._4_4_ * fVar43;
              auVar34._8_4_ = local_1368._8_4_ * fVar43;
              auVar34._12_4_ = local_1368._12_4_ * fVar43;
              auVar8 = vcmpps_avx(auVar34,local_1378,1);
              fVar43 = ray->tfar;
              auVar38._0_4_ = local_1368._0_4_ * fVar43;
              auVar38._4_4_ = local_1368._4_4_ * fVar43;
              auVar38._8_4_ = local_1368._8_4_ * fVar43;
              auVar38._12_4_ = local_1368._12_4_ * fVar43;
              auVar39 = vcmpps_avx(local_1378,auVar38,2);
              auVar8 = vandps_avx(auVar39,auVar8);
              local_1348 = vandps_avx(auVar7,auVar8);
              uVar14 = vmovmskps_avx(local_1348);
              if (uVar14 != 0) {
                local_1420 = local_1450->scene;
                auVar7 = vrcpps_avx(local_1368);
                auVar25._8_4_ = 0x3f800000;
                auVar25._0_8_ = 0x3f8000003f800000;
                auVar25._12_4_ = 0x3f800000;
                auVar8 = vfnmadd213ps_fma(local_1368,auVar7,auVar25);
                auVar7 = vfmadd132ps_fma(auVar8,auVar7,auVar7);
                fVar43 = auVar7._0_4_;
                fVar32 = auVar7._4_4_;
                fVar45 = auVar7._8_4_;
                fVar46 = auVar7._12_4_;
                local_1318[0] = fVar43 * local_1378._0_4_;
                local_1318[1] = fVar32 * local_1378._4_4_;
                local_1318[2] = fVar45 * local_1378._8_4_;
                local_1318[3] = fVar46 * local_1378._12_4_;
                local_1338[0] = fVar43 * local_1398._0_4_;
                local_1338[1] = fVar32 * local_1398._4_4_;
                local_1338[2] = fVar45 * local_1398._8_4_;
                local_1338[3] = fVar46 * local_1398._12_4_;
                local_1328._0_4_ = fVar43 * local_1388._0_4_;
                local_1328._4_4_ = fVar32 * local_1388._4_4_;
                local_1328._8_4_ = fVar45 * local_1388._8_4_;
                local_1328._12_4_ = fVar46 * local_1388._12_4_;
                local_1458 = (ulong)(uVar14 & 0xff);
                local_1460 = lVar16 + uVar21;
                do {
                  uVar13 = 0;
                  for (uVar15 = local_1458; (uVar15 & 1) == 0;
                      uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                    uVar13 = uVar13 + 1;
                  }
                  local_1400 = *(uint *)(local_1460 + 0x90 + uVar13 * 4);
                  local_1448 = (local_1420->geometries).items[local_1400].ptr;
                  if ((local_1448->mask & ray->mask) == 0) {
                    local_1458 = local_1458 ^ 1L << (uVar13 & 0x3f);
                  }
                  else {
                    if ((local_1450->args->filter == (RTCFilterFunctionN)0x0) &&
                       (local_1448->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_004d4096:
                      ray->tfar = -INFINITY;
                      return;
                    }
                    local_1468 = local_1450->args;
                    uVar15 = (ulong)(uint)((int)uVar13 * 4);
                    local_13e8.context = local_1450->user;
                    local_1418 = *(undefined4 *)(local_1308 + uVar15);
                    local_1414 = *(undefined4 *)(local_12f8 + uVar15);
                    local_1410 = *(undefined4 *)(local_12e8 + uVar15);
                    local_140c = *(undefined4 *)((long)local_1338 + uVar15);
                    local_1408 = *(undefined4 *)(local_1328 + uVar15);
                    local_1404 = *(undefined4 *)(local_1460 + 0xa0 + uVar15);
                    local_13fc = (local_13e8.context)->instID[0];
                    local_13f8 = (local_13e8.context)->instPrimID[0];
                    fVar43 = ray->tfar;
                    ray->tfar = *(float *)((long)local_1318 + uVar15);
                    local_146c = -1;
                    local_13e8.valid = &local_146c;
                    local_13e8.geometryUserPtr = local_1448->userPtr;
                    local_13e8.hit = (RTCHitN *)&local_1418;
                    local_13e8.N = 1;
                    local_13e8.ray = (RTCRayN *)ray;
                    if (((local_1448->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*local_1448->occlusionFilterN)(&local_13e8), *local_13e8.valid != 0)) &&
                       ((local_1468->filter == (RTCFilterFunctionN)0x0 ||
                        ((((local_1468->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          (((local_1448->field_8).field_0x2 & 0x40) == 0)) ||
                         ((*local_1468->filter)(&local_13e8), *local_13e8.valid != 0))))))
                    goto LAB_004d4096;
                    ray->tfar = fVar43;
                    local_1458 = local_1458 ^ 1L << (uVar13 & 0x3f);
                  }
                } while (local_1458 != 0);
              }
            }
            local_1440 = local_1440 + 1;
          } while (local_1440 != local_1438);
        }
        auVar44 = ZEXT3264(local_11f8);
        auVar48 = ZEXT3264(local_1218);
        auVar52 = ZEXT3264(local_1238);
        auVar58 = ZEXT3264(local_1258);
        auVar60 = ZEXT3264(local_1278);
        auVar63 = ZEXT3264(local_1298);
        auVar66 = ZEXT3264(local_12b8);
        auVar68 = ZEXT3264(local_12d8);
      } while (local_1428 != &local_11d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }